

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

substr __thiscall c4::yml::Parser::_finish_filter_arena(Parser *this,substr dst,size_t pos)

{
  code *pcVar1;
  Location LVar2;
  Location LVar3;
  bool bVar4;
  ulong len_;
  char *s_;
  substr sVar5;
  char msg [42];
  basic_substring<char> local_a8;
  undefined7 uStack_98;
  undefined1 uStack_91;
  undefined2 uStack_90;
  undefined5 local_8e;
  undefined1 uStack_89;
  undefined2 uStack_88;
  char acStack_86 [22];
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  char *pcStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  char *pcStack_30;
  undefined8 local_28;
  
  s_ = dst.str;
  if ((this->m_filter_arena).len < pos) {
    uStack_88 = 0x6572;
    builtin_strncpy(acStack_86,"na.len)",8);
    uStack_98 = 0x6d203d3c20736f;
    uStack_91 = 0x5f;
    uStack_90 = 0x6966;
    local_8e = 0x5f7265746c;
    uStack_89 = 0x61;
    local_a8.str = (char *)0x6166206b63656863;
    local_a8.len._0_7_ = 0x28203a64656c69;
    local_a8.len._7_1_ = 0x70;
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar1 = (code *)swi(3);
        sVar5 = (substr)(*pcVar1)();
        return sVar5;
      }
    }
    local_48 = 0;
    uStack_40 = 0x7f81;
    local_38 = 0;
    pcStack_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_28 = 0x65;
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x7f81) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x7f81) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_a8,0x2a,LVar2,(this->m_stack).m_callbacks.m_user_data);
  }
  if (dst.len < pos) {
    uStack_98 = 0x64203d3c20736f;
    uStack_91 = 0x73;
    uStack_90 = 0x2e74;
    local_8e = 0x296e656c;
    local_a8.str = (char *)0x6166206b63656863;
    local_a8.len._0_7_ = 0x28203a64656c69;
    local_a8.len._7_1_ = 0x70;
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar1 = (code *)swi(3);
        sVar5 = (substr)(*pcVar1)();
        return sVar5;
      }
    }
    local_70 = 0;
    uStack_68 = 0x7f82;
    local_60 = 0;
    pcStack_58 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_50 = 0x65;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x7f82) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x7f82) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_a8,0x1f,LVar3,(this->m_stack).m_callbacks.m_user_data);
    memcpy(s_,(this->m_filter_arena).str,pos);
    if (pos != 0xffffffffffffffff) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar4 = is_debugger_attached();
        if (bVar4) {
          pcVar1 = (code *)swi(3);
          sVar5 = (substr)(*pcVar1)();
          return sVar5;
        }
      }
      handle_error(0x1f7f77,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x154e,"num <= len || num == npos");
    }
  }
  else {
    memcpy(s_,(this->m_filter_arena).str,pos);
  }
  len_ = dst.len;
  if (pos != 0xffffffffffffffff) {
    len_ = pos;
  }
  basic_substring<char>::basic_substring(&local_a8,s_,len_);
  sVar5.len._0_7_ = (undefined7)local_a8.len;
  sVar5.str = local_a8.str;
  sVar5.len._7_1_ = local_a8.len._7_1_;
  return sVar5;
}

Assistant:

substr Parser::_finish_filter_arena(substr dst, size_t pos)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= m_filter_arena.len);
    _RYML_CB_ASSERT(m_stack.m_callbacks, pos <= dst.len);
    memcpy(dst.str, m_filter_arena.str, pos);
    return dst.first(pos);
}